

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O3

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionArgument *e)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  FunctionArgument *local_10;
  
  local_30._M_unused._M_object = &local_10;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/evaluator/DefaultEvaluator.cpp:304:13)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/evaluator/DefaultEvaluator.cpp:304:13)>
             ::_M_manager;
  local_30._8_8_ = this;
  local_10 = e;
  no_echo((function<void_()> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionArgument *e) {
    no_echo([&]{
        // Evaluate the default value if present
        if (e->get_default_value()) {
            e->get_default_value()->accept(this);
        }
    });
}